

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_key.cpp
# Opt level: O0

void __thiscall jbcoin::openssl::ec_key::ec_key(ec_key *this,ec_key *that)

{
  EC_KEY *pEVar1;
  EC_KEY *pEVar2;
  ec_key *that_local;
  ec_key *this_local;
  
  if (that->ptr == (pointer_t)0x0) {
    this->ptr = (pointer_t)0x0;
  }
  else {
    pEVar1 = get_EC_KEY(that);
    pEVar2 = EC_KEY_dup((EC_KEY *)pEVar1);
    this->ptr = (pointer_t)pEVar2;
    if (this->ptr == (pointer_t)0x0) {
      Throw<std::runtime_error,char_const(&)[37]>
                ((char (*) [37])"ec_key::ec_key() : EC_KEY_dup failed");
    }
    pEVar1 = get_EC_KEY(this);
    EC_KEY_set_conv_form((EC_KEY *)pEVar1,POINT_CONVERSION_COMPRESSED);
  }
  return;
}

Assistant:

ec_key::ec_key (const ec_key& that)
{
    if (that.ptr == nullptr)
    {
        ptr = nullptr;
        return;
    }

    ptr = (pointer_t) EC_KEY_dup (get_EC_KEY (that));

    if (ptr == nullptr)
        Throw<std::runtime_error> ("ec_key::ec_key() : EC_KEY_dup failed");

    EC_KEY_set_conv_form (get_EC_KEY (*this), POINT_CONVERSION_COMPRESSED);
}